

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void * mz_zip_reader_extract_file_to_heap
                 (mz_zip_archive *pZip,char *pFilename,size_t *pSize,mz_uint flags)

{
  mz_uint file_index;
  void *pvVar1;
  
  file_index = mz_zip_reader_locate_file(pZip,pFilename,(char *)0x0,flags);
  if (-1 < (int)file_index) {
    pvVar1 = mz_zip_reader_extract_to_heap(pZip,file_index,pSize,flags);
    return pvVar1;
  }
  if (pSize != (size_t *)0x0) {
    *pSize = 0;
  }
  return (void *)0x0;
}

Assistant:

void *mz_zip_reader_extract_file_to_heap(mz_zip_archive *pZip,
                                         const char *pFilename, size_t *pSize,
                                         mz_uint flags) {
  int file_index = mz_zip_reader_locate_file(pZip, pFilename, NULL, flags);
  if (file_index < 0) {
    if (pSize)
      *pSize = 0;
    return MZ_FALSE;
  }
  return mz_zip_reader_extract_to_heap(pZip, file_index, pSize, flags);
}